

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O2

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>::CalculateQ
          (ChContactSMC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_> *this,
          ChState *stateA_x,ChStateDelta *stateA_w,ChState *stateB_x,ChStateDelta *stateB_w,
          ChMaterialCompositeSMC *mat,ChVectorDynamic<> *Q)

{
  undefined1 auVar1 [16];
  ChContactable_1vars<6> *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  ChVector<double> vel1;
  ChVector<double> p1_loc;
  ChVector<double> p2_abs;
  ChVector<double> p2_loc;
  ChVector<double> p1_abs;
  ChVector<double> force;
  ChVector<double> vel2;
  ChVector<double> normal_dir;
  ChVector<double> local_158;
  double local_138;
  undefined8 uStack_130;
  ChVector<double> local_120;
  undefined1 local_108 [16];
  double local_f8;
  ChVector<double> local_f0;
  ChCoordsys<double> local_d8;
  undefined1 local_98 [16];
  undefined8 local_88;
  ChVector<double> local_78;
  ChVector<double> local_60;
  ChVector<double> local_48;
  undefined1 extraout_var [56];
  
  (*(((this->super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
     objA)->super_ChContactable)._vptr_ChContactable[0xb])(&local_d8);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_120,&local_d8,
             &(this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
              .p1);
  (*(((this->super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
     objB)->super_ChContactable)._vptr_ChContactable[0xb])(&local_d8);
  ChCoordsys<double>::TransformPointParentToLocal
            (&local_f0,&local_d8,
             &(this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
              .p2);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objA;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[8])(&local_d8,pCVar2,&local_120,stateA_x);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objB;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[8])(local_108,pCVar2,&local_f0,stateB_x);
  local_158.m_data._0_16_ = vsubpd_avx((undefined1  [16])local_d8.pos.m_data._0_16_,local_108);
  local_158.m_data[2] = local_d8.pos.m_data[2] - local_f8;
  ChVector<double>::GetNormalized(&local_48,&local_158);
  local_158.m_data._0_16_ = vsubpd_avx((undefined1  [16])local_d8.pos.m_data._0_16_,local_108);
  local_158.m_data[2] = local_d8.pos.m_data[2] - local_f8;
  auVar9._0_8_ = ChVector<double>::Length(&local_158);
  auVar9._8_56_ = extraout_var;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_48.m_data[0];
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_48.m_data[2];
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objA;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (this->
                 super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                 ).normal.m_data[0];
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_48.m_data[1] *
       (this->super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
       .normal.m_data[1];
  auVar1 = vfmadd231sd_fma(auVar10,auVar11,auVar1);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (this->
                 super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>
                 ).normal.m_data[2];
  auVar1 = vfmadd132sd_fma(auVar12,auVar1,auVar7);
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar7 = vxorpd_avx512vl(auVar9._0_16_,auVar5);
  uVar3 = vcmpsd_avx512f(auVar1,ZEXT816(0),1);
  bVar4 = (bool)((byte)uVar3 & 1);
  local_138 = (double)((ulong)bVar4 * auVar7._0_8_ + (ulong)!bVar4 * (long)auVar9._0_8_);
  uStack_130 = extraout_var._0_8_;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[9])
            (&local_158,pCVar2,&local_120,stateA_x,stateA_w);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objB;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[9])
            (&local_60,pCVar2,&local_f0,stateB_x,stateB_w);
  CalculateForce(&local_78,this,local_138,&local_48,&local_158,&local_60,mat);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objA;
  auVar8._0_8_ = -local_78.m_data[2];
  auVar8._8_4_ = 0;
  auVar8._12_4_ = 0x80000000;
  local_98._0_8_ = local_78.m_data[0] ^ 0x8000000000000000;
  local_98._8_4_ = local_78.m_data[1]._0_4_;
  local_98._12_4_ = local_78.m_data[1]._4_4_ ^ 0x80000000;
  local_88 = vmovlps_avx(auVar8);
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[0xd])(pCVar2,local_98,&local_d8,stateA_x,Q,0);
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>).
           objB;
  uVar6 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<6>_>)
             .objA)->super_ChContactable)._vptr_ChContactable[4])();
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[0xd])
            (pCVar2,&local_78,local_108,stateB_x,Q,(ulong)uVar6);
  return;
}

Assistant:

void CalculateQ(const ChState& stateA_x,            ///< state positions for objA
                    const ChStateDelta& stateA_w,       ///< state velocities for objA
                    const ChState& stateB_x,            ///< state positions for objB
                    const ChStateDelta& stateB_w,       ///< state velocities for objB
                    const ChMaterialCompositeSMC& mat,  ///< composite material for contact pair
                    ChVectorDynamic<>& Q                ///< output generalized forces
    ) {
        // Express contact points in local frames.
        // We assume that these points remain fixed to their respective contactable objects.
        ChVector<> p1_loc = this->objA->GetCsysForCollisionModel().TransformPointParentToLocal(this->p1);
        ChVector<> p2_loc = this->objB->GetCsysForCollisionModel().TransformPointParentToLocal(this->p2);

        // Express the local points in global frame
        ChVector<> p1_abs = this->objA->GetContactPoint(p1_loc, stateA_x);
        ChVector<> p2_abs = this->objB->GetContactPoint(p2_loc, stateB_x);

        /*
            Note: while this can be somewhat justified for a ChBody, it will not work
                  for a mesh vertex for instance...

        // Project the points onto the unperturbed normal line
        p1_abs = this->p1 + Vdot(p1_abs - this->p1, this->normal) * this->normal;
        p2_abs = this->p2 + Vdot(p2_abs - this->p2, this->normal) * this->normal;
        */

        // Calculate normal direction (expressed in global frame)
        ChVector<> normal_dir = (p1_abs - p2_abs).GetNormalized();

        // Calculate penetration depth
        double delta = (p1_abs - p2_abs).Length();

        // If the normal direction flipped sign, change sign of delta
        if (Vdot(normal_dir, this->normal) < 0)
            delta = -delta;

        // Calculate velocity of contact points (expressed in global frame)
        ChVector<> vel1 = this->objA->GetContactPointSpeed(p1_loc, stateA_x, stateA_w);
        ChVector<> vel2 = this->objB->GetContactPointSpeed(p2_loc, stateB_x, stateB_w);

        // Compute the contact force.
        ChVector<> force = CalculateForce(delta, normal_dir, vel1, vel2, mat);

        // Compute and load the generalized contact forces.
        this->objA->ContactForceLoadQ(-force, p1_abs, stateA_x, Q, 0);
        this->objB->ContactForceLoadQ(force, p2_abs, stateB_x, Q, this->objA->ContactableGet_ndof_w());
    }